

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

Message __thiscall Client::Receive(Client *this)

{
  Message MVar1;
  ssize_t sVar2;
  Client *this_local;
  Message msg;
  
  Message::Message((Message *)&this_local);
  sVar2 = recv(this->sockfd,&this_local,0x10,0);
  this->n = (int)sVar2;
  if (this->n < 0) {
    printf("ERROR reading from client socket in Alice!\n");
  }
  else {
    (this->msg_from_server).scalar1 = (long)this_local;
    (this->msg_from_server).scalar2 = msg.scalar1;
  }
  MVar1.scalar2 = msg.scalar1;
  MVar1.scalar1 = (long)this_local;
  return MVar1;
}

Assistant:

const Message Client::Receive()
{
    Message msg;
    n = recv(sockfd, &msg, sizeof(msg), 0);
    if (n < 0)
        printf("ERROR reading from client socket in Alice!\n");
    else
        msg_from_server = msg;
  
    return msg;
}